

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::ParseGoogleTestFlagsOnlyImpl<wchar_t>(int *argc,wchar_t **argv)

{
  int iVar1;
  char *str;
  bool bVar2;
  String *str_00;
  int iVar3;
  long lVar4;
  String arg_string;
  
  iVar3 = 1;
  str_00 = (String *)argc;
  do {
    if (*argc <= iVar3) {
      if (g_help_flag != '\0') {
        PrintColorEncoded((char *)str_00);
      }
      return;
    }
    lVar4 = (long)iVar3;
    StreamableToString<wchar_t*>((internal *)&arg_string,argv + lVar4);
    str = arg_string.c_str_;
    bVar2 = ParseBoolFlag(arg_string.c_str_,"also_run_disabled_tests",
                          (bool *)&FLAGS_gtest_also_run_disabled_tests);
    if (bVar2) {
LAB_0011d48b:
      iVar1 = *argc;
      for (; iVar1 != lVar4; lVar4 = lVar4 + 1) {
        argv[lVar4] = argv[lVar4 + 1];
      }
      *argc = iVar1 + -1;
      iVar3 = iVar3 + -1;
    }
    else {
      bVar2 = ParseBoolFlag(str,"break_on_failure",(bool *)&FLAGS_gtest_break_on_failure);
      if (bVar2) goto LAB_0011d48b;
      bVar2 = ParseBoolFlag(str,"catch_exceptions",(bool *)&FLAGS_gtest_catch_exceptions);
      if (bVar2) goto LAB_0011d48b;
      bVar2 = ParseStringFlag(str,"color",(String *)&FLAGS_gtest_color);
      if (bVar2) goto LAB_0011d48b;
      bVar2 = ParseStringFlag(str,"death_test_style",(String *)&FLAGS_gtest_death_test_style);
      if (bVar2) goto LAB_0011d48b;
      bVar2 = ParseBoolFlag(str,"death_test_use_fork",(bool *)&FLAGS_gtest_death_test_use_fork);
      if (bVar2) goto LAB_0011d48b;
      bVar2 = ParseStringFlag(str,"filter",(String *)&FLAGS_gtest_filter);
      if (bVar2) goto LAB_0011d48b;
      bVar2 = ParseStringFlag(str,"internal_run_death_test",
                              (String *)&FLAGS_gtest_internal_run_death_test);
      if (bVar2) goto LAB_0011d48b;
      bVar2 = ParseBoolFlag(str,"list_tests",(bool *)&FLAGS_gtest_list_tests);
      if (bVar2) goto LAB_0011d48b;
      bVar2 = ParseStringFlag(str,"output",(String *)&FLAGS_gtest_output);
      if (bVar2) goto LAB_0011d48b;
      bVar2 = ParseBoolFlag(str,"print_time",(bool *)&FLAGS_gtest_print_time);
      if (bVar2) goto LAB_0011d48b;
      bVar2 = ParseInt32Flag(str,"random_seed",&FLAGS_gtest_random_seed);
      if (bVar2) goto LAB_0011d48b;
      bVar2 = ParseInt32Flag(str,"repeat",&FLAGS_gtest_repeat);
      if (bVar2) goto LAB_0011d48b;
      bVar2 = ParseBoolFlag(str,"shuffle",(bool *)&FLAGS_gtest_shuffle);
      if (bVar2) goto LAB_0011d48b;
      bVar2 = ParseInt32Flag(str,"stack_trace_depth",&FLAGS_gtest_stack_trace_depth);
      if (bVar2) goto LAB_0011d48b;
      bVar2 = ParseStringFlag(str,"stream_result_to",(String *)FLAGS_gtest_stream_result_to);
      if (bVar2) goto LAB_0011d48b;
      bVar2 = ParseBoolFlag(str,"throw_on_failure",(bool *)&FLAGS_gtest_throw_on_failure);
      if (bVar2) goto LAB_0011d48b;
      bVar2 = String::operator==(&arg_string,"--help");
      if (bVar2) {
LAB_0011d511:
        g_help_flag = '\x01';
      }
      else {
        bVar2 = String::operator==(&arg_string,"-h");
        if (bVar2) goto LAB_0011d511;
        bVar2 = String::operator==(&arg_string,"-?");
        if (bVar2) goto LAB_0011d511;
        bVar2 = String::operator==(&arg_string,"/?");
        if (bVar2) goto LAB_0011d511;
        bVar2 = HasGoogleTestFlagPrefix((char *)0x11d50d);
        if (bVar2) goto LAB_0011d511;
      }
    }
    str_00 = &arg_string;
    String::~String(&arg_string);
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

void ParseGoogleTestFlagsOnlyImpl(int* argc, CharType** argv) {
  for (int i = 1; i < *argc; i++) {
    const String arg_string = StreamableToString(argv[i]);
    const char* const arg = arg_string.c_str();

    using internal::ParseBoolFlag;
    using internal::ParseInt32Flag;
    using internal::ParseStringFlag;

    // Do we see a Google Test flag?
    if (ParseBoolFlag(arg, kAlsoRunDisabledTestsFlag,
                      &GTEST_FLAG(also_run_disabled_tests)) ||
        ParseBoolFlag(arg, kBreakOnFailureFlag,
                      &GTEST_FLAG(break_on_failure)) ||
        ParseBoolFlag(arg, kCatchExceptionsFlag,
                      &GTEST_FLAG(catch_exceptions)) ||
        ParseStringFlag(arg, kColorFlag, &GTEST_FLAG(color)) ||
        ParseStringFlag(arg, kDeathTestStyleFlag,
                        &GTEST_FLAG(death_test_style)) ||
        ParseBoolFlag(arg, kDeathTestUseFork,
                      &GTEST_FLAG(death_test_use_fork)) ||
        ParseStringFlag(arg, kFilterFlag, &GTEST_FLAG(filter)) ||
        ParseStringFlag(arg, kInternalRunDeathTestFlag,
                        &GTEST_FLAG(internal_run_death_test)) ||
        ParseBoolFlag(arg, kListTestsFlag, &GTEST_FLAG(list_tests)) ||
        ParseStringFlag(arg, kOutputFlag, &GTEST_FLAG(output)) ||
        ParseBoolFlag(arg, kPrintTimeFlag, &GTEST_FLAG(print_time)) ||
        ParseInt32Flag(arg, kRandomSeedFlag, &GTEST_FLAG(random_seed)) ||
        ParseInt32Flag(arg, kRepeatFlag, &GTEST_FLAG(repeat)) ||
        ParseBoolFlag(arg, kShuffleFlag, &GTEST_FLAG(shuffle)) ||
        ParseInt32Flag(arg, kStackTraceDepthFlag,
                       &GTEST_FLAG(stack_trace_depth)) ||
        ParseStringFlag(arg, kStreamResultToFlag,
                        &GTEST_FLAG(stream_result_to)) ||
        ParseBoolFlag(arg, kThrowOnFailureFlag,
                      &GTEST_FLAG(throw_on_failure))
        ) {
      // Yes.  Shift the remainder of the argv list left by one.  Note
      // that argv has (*argc + 1) elements, the last one always being
      // NULL.  The following loop moves the trailing NULL element as
      // well.
      for (int j = i; j != *argc; j++) {
        argv[j] = argv[j + 1];
      }

      // Decrements the argument count.
      (*argc)--;

      // We also need to decrement the iterator as we just removed
      // an element.
      i--;
    } else if (arg_string == "--help" || arg_string == "-h" ||
               arg_string == "-?" || arg_string == "/?" ||
               HasGoogleTestFlagPrefix(arg)) {
      // Both help flag and unrecognized Google Test flags (excluding
      // internal ones) trigger help display.
      g_help_flag = true;
    }
  }

  if (g_help_flag) {
    // We print the help here instead of in RUN_ALL_TESTS(), as the
    // latter may not be called at all if the user is using Google
    // Test with another testing framework.
    PrintColorEncoded(kColorEncodedHelpMessage);
  }
}